

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

Nurse * __thiscall
Hospital::Find_Nurse_From_His_Id
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  Nurse::nurse_all_ino_getter_abi_cxx11_
            (&local_30,
             (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::operator==(local_30.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,id);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  return (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

Nurse* Hospital:: Find_Nurse_From_His_Id (vector<Nurse>& All_Of_Nurses,string id){
    for (int A = 0; A < All_Of_Nurses.size() ; ++A) {
        if (All_Of_Nurses[A].nurse_all_ino_getter()[0]==id)
            return &All_Of_Nurses[A];
        break;
    }
}